

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

_Bool bad_domain(char *domain)

{
  int iVar1;
  char *pcVar2;
  char *dot;
  char *domain_local;
  
  iVar1 = Curl_strcasecompare(domain,"localhost");
  if (iVar1 == 0) {
    pcVar2 = strchr(domain,0x2e);
    if (pcVar2 == (char *)0x0) {
      domain_local._7_1_ = true;
    }
    else {
      domain_local._7_1_ = pcVar2[1] == '\0';
    }
  }
  else {
    domain_local._7_1_ = false;
  }
  return domain_local._7_1_;
}

Assistant:

static bool bad_domain(const char *domain)
{
  if(strcasecompare(domain, "localhost"))
    return FALSE;
  else {
    /* there must be a dot present, but that dot must not be a trailing dot */
    char *dot = strchr(domain, '.');
    if(dot)
      return dot[1] ? FALSE : TRUE;
  }
  return TRUE;
}